

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O2

void __thiscall
duckdb::TopNHeap::AddLargeHeap(TopNHeap *this,DataChunk *input,Vector *sort_keys_vec)

{
  idx_t iVar1;
  bool bVar2;
  idx_t r;
  ulong uVar3;
  idx_t sel_count;
  anon_struct_16_3_d7536bce_for_pointer *sort_key;
  anon_union_16_2_67f50693_for_value local_48;
  long local_38;
  
  sort_key = (anon_struct_16_3_d7536bce_for_pointer *)sort_keys_vec->data;
  iVar1 = (this->heap_data).count;
  sel_count = 0;
  for (uVar3 = 0; uVar3 < input->count; uVar3 = uVar3 + 1) {
    bVar2 = EntryShouldBeAdded(this,(string_t *)sort_key);
    if (bVar2) {
      if (sort_key->length < 0xd) {
        local_48.pointer = *sort_key;
      }
      else {
        local_48.pointer =
             (anon_struct_16_3_d7536bce_for_pointer)
             StringHeap::AddBlob(&this->sort_key_heap,(string_t *)sort_key);
      }
      local_38 = sel_count + iVar1;
      AddEntryToHeap(this,(TopNEntry *)&local_48.pointer);
      (this->matching_sel).sel_vector[sel_count] = (sel_t)uVar3;
      sel_count = sel_count + 1;
    }
    sort_key = sort_key + 1;
  }
  if (sel_count != 0) {
    DataChunk::Append(&this->heap_data,input,true,&this->matching_sel,sel_count);
  }
  return;
}

Assistant:

void TopNHeap::AddLargeHeap(DataChunk &input, Vector &sort_keys_vec) {
	auto sort_key_values = FlatVector::GetData<string_t>(sort_keys_vec);
	idx_t base_index = heap_data.size();
	idx_t match_count = 0;
	for (idx_t r = 0; r < input.size(); r++) {
		auto &sort_key = sort_key_values[r];
		if (!EntryShouldBeAdded(sort_key)) {
			continue;
		}
		// replace the previous top entry with the new entry
		TopNEntry entry;
		entry.sort_key = sort_key.IsInlined() ? sort_key : sort_key_heap.AddBlob(sort_key);
		entry.index = base_index + match_count;
		AddEntryToHeap(entry);
		matching_sel.set_index(match_count++, r);
	}
	if (match_count == 0) {
		// early-out: no matches
		return;
	}

	// copy over the input rows to the payload chunk
	heap_data.Append(input, true, &matching_sel, match_count);
}